

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

void __thiscall
Js::AsmJSByteCodeGenerator::EmitEmptyByteCode::AutoCleanup::~AutoCleanup(AutoCleanup *this)

{
  if (this->mFunctionBody != (FunctionBody *)0x0) {
    FunctionBody::ResetByteCodeGenState(this->mFunctionBody);
    ByteCodeWriter::Reset(&this->mByteCodeGen->m_writer);
  }
  return;
}

Assistant:

~AutoCleanup()
            {
                if (mFunctionBody)
                {
                    mFunctionBody->ResetByteCodeGenState();
                    mByteCodeGen->Writer()->Reset();
                }
            }